

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpprotocolhandler.cpp
# Opt level: O2

bool __thiscall QHttpProtocolHandler::sendRequest(QHttpProtocolHandler *this)

{
  qint64 *pqVar1;
  ChannelState CVar2;
  QHttpNetworkReply *pQVar3;
  QHttpNetworkReplyPrivate *this_00;
  QHttpNetworkConnectionPrivate *this_01;
  qsizetype qVar4;
  QIODevice *pQVar5;
  Data *pDVar6;
  bool bVar7;
  bool bVar8;
  int fromChannel;
  ProxyType PVar9;
  QHttpNetworkConnectionChannel *pQVar10;
  QSslSocket *this_02;
  long lVar11;
  long lVar12;
  char *pcVar13;
  QHttpNetworkRequestPrivate *pQVar14;
  QNonContiguousByteDevice *pQVar15;
  qint64 qVar16;
  QDebug *pQVar17;
  NetworkError errorCode;
  qint64 headerSize;
  QAuthenticator *this_03;
  long in_FS_OFFSET;
  QObject local_c8 [8];
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  qint64 currentReadSize;
  long local_80;
  QArrayDataPointer<char16_t> local_78;
  QUrl url;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = (this->super_QAbstractProtocolHandler).m_channel;
  pQVar3 = pQVar10->reply;
  (this->super_QAbstractProtocolHandler).m_reply = pQVar3;
  if (pQVar3 == (QHttpNetworkReply *)0x0) {
    local_58.d._0_4_ = 2;
    local_58.size._4_4_ = 0;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_40 = "default";
    bVar8 = false;
    QMessageLogger::warning
              ((char *)&local_58,
               "QAbstractProtocolHandler::sendRequest() called without QHttpNetworkReply");
    goto LAB_001f8399;
  }
  CVar2 = pQVar10->state;
  bVar8 = true;
  if (CVar2 == WaitingState) {
    pQVar15 = QHttpNetworkRequest::uploadByteDevice(&pQVar10->request);
    if (pQVar15 != (QNonContiguousByteDevice *)0x0) {
      QObject::disconnect((QObject *)pQVar15,"2readyRead()",
                          &((this->super_QAbstractProtocolHandler).m_channel)->super_QObject,
                          "1_q_uploadDataReadyRead()");
    }
    lVar11 = (**(code **)(*(long *)(this->super_QAbstractProtocolHandler).m_socket + 0xa0))();
    if (lVar11 != 0) {
      QMetaObject::invokeMethod<>
                (&((this->super_QAbstractProtocolHandler).m_channel)->super_QObject,
                 "_q_receiveReply",QueuedConnection);
    }
    goto LAB_001f8399;
  }
  if (CVar2 == WritingState) {
    pQVar15 = QHttpNetworkRequest::uploadByteDevice(&pQVar10->request);
    if ((pQVar15 != (QNonContiguousByteDevice *)0x0) &&
       (pQVar10 = (this->super_QAbstractProtocolHandler).m_channel,
       pQVar10->bytesTotal != pQVar10->written)) {
      this_02 = QtPrivate::qobject_cast_helper<QSslSocket*,QObject>
                          ((QObject *)(this->super_QAbstractProtocolHandler).m_socket);
      do {
        lVar11 = (**(code **)(*(long *)(this->super_QAbstractProtocolHandler).m_socket + 0xa8))();
        if (this_02 == (QSslSocket *)0x0) {
          lVar12 = 0;
        }
        else {
          lVar12 = QSslSocket::encryptedBytesToWrite(this_02);
        }
        if ((0x8000 < lVar12 + lVar11) ||
           (pQVar10 = (this->super_QAbstractProtocolHandler).m_channel,
           lVar11 = pQVar10->bytesTotal - pQVar10->written, lVar11 == 0)) goto LAB_001f8202;
        currentReadSize = 0;
        if (0x3fff < lVar11) {
          lVar11 = 0x4000;
        }
        pcVar13 = (char *)(**(code **)(*(long *)pQVar15 + 0x60))(pQVar15,lVar11,&currentReadSize);
        if (currentReadSize == -1) {
LAB_001f837f:
          errorCode = UnknownNetworkError;
LAB_001f8382:
          QHttpNetworkConnectionPrivate::emitReplyError
                    (*(QHttpNetworkConnectionPrivate **)
                      &((this->super_QAbstractProtocolHandler).m_connection)->field_0x8,
                     (this->super_QAbstractProtocolHandler).m_socket,
                     (this->super_QAbstractProtocolHandler).m_reply,errorCode);
          goto LAB_001f8397;
        }
        if ((pcVar13 == (char *)0x0) || (currentReadSize == 0)) goto LAB_001f8202;
        lVar11 = ((this->super_QAbstractProtocolHandler).m_channel)->written;
        lVar12 = (**(code **)(*(long *)pQVar15 + 0x78))(pQVar15);
        if (lVar11 != lVar12) {
          local_58.d._0_4_ = 2;
          local_58.size._4_4_ = 0;
          local_58.d._4_4_ = 0;
          local_58.ptr._0_4_ = 0;
          local_58.ptr._4_4_ = 0;
          local_58.size._0_4_ = 0;
          local_40 = "default";
          QMessageLogger::warning();
          pQVar17 = QDebug::operator<<((QDebug *)&local_78,
                                       "QHttpProtocolHandler: Internal error in sendRequest. Expected to write at position"
                                      );
          pQVar17 = QDebug::operator<<(pQVar17,((this->super_QAbstractProtocolHandler).m_channel)->
                                               written);
          pQVar17 = QDebug::operator<<(pQVar17,"but read device is at");
          qVar16 = (**(code **)(*(long *)pQVar15 + 0x78))(pQVar15);
          QDebug::operator<<(pQVar17,qVar16);
          QDebug::~QDebug((QDebug *)&local_78);
          errorCode = ProtocolFailure;
          goto LAB_001f8382;
        }
        lVar11 = (this->m_header).d.size;
        if (lVar11 == 0) {
          lVar11 = QIODevice::write((char *)(this->super_QAbstractProtocolHandler).m_socket,
                                    (longlong)pcVar13);
        }
        else {
          QByteArray::append(&this->m_header,pcVar13,currentReadSize);
          pQVar5 = (this->super_QAbstractProtocolHandler).m_socket;
          local_78.d = (Data *)0x0;
          local_78.ptr = (char16_t *)0x0;
          local_78.size = 0;
          std::__exchange<QByteArray,QByteArray>
                    ((QByteArray *)&local_58,&this->m_header,(QByteArray *)&local_78);
          lVar12 = QIODevice::write((QByteArray *)pQVar5);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
          lVar11 = lVar12 - lVar11;
          if (lVar12 == -1) {
            lVar11 = -1;
          }
          QMetaObject::invokeMethod<>
                    (&((this->super_QAbstractProtocolHandler).m_reply)->super_QObject,"requestSent",
                     QueuedConnection);
        }
        if ((lVar11 == -1) || (lVar11 != currentReadSize)) goto LAB_001f837f;
        pqVar1 = &((this->super_QAbstractProtocolHandler).m_channel)->written;
        *pqVar1 = *pqVar1 + lVar11;
        (**(code **)(*(long *)pQVar15 + 0x68))(pQVar15,lVar11);
        pQVar10 = (this->super_QAbstractProtocolHandler).m_channel;
        QHttpNetworkReply::dataSendProgress
                  ((QHttpNetworkReply *)(this->super_QAbstractProtocolHandler).m_reply,
                   pQVar10->written,pQVar10->bytesTotal);
        pQVar10 = (this->super_QAbstractProtocolHandler).m_channel;
      } while (pQVar10->written != pQVar10->bytesTotal);
      pQVar10->state = WaitingState;
      (*(this->super_QAbstractProtocolHandler)._vptr_QAbstractProtocolHandler[4])(this);
LAB_001f8202:
      bVar8 = true;
      goto LAB_001f8399;
    }
    if ((this->m_header).d.size != 0) {
      pQVar5 = (this->super_QAbstractProtocolHandler).m_socket;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_78.size = 0;
      std::__exchange<QByteArray,QByteArray>
                ((QByteArray *)&local_58,&this->m_header,(QByteArray *)&local_78);
      QIODevice::write((QByteArray *)pQVar5);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
    }
    pQVar10 = (this->super_QAbstractProtocolHandler).m_channel;
    if (pQVar15 != (QNonContiguousByteDevice *)0x0) {
      QHttpNetworkReply::dataSendProgress
                ((QHttpNetworkReply *)(this->super_QAbstractProtocolHandler).m_reply,
                 pQVar10->written,pQVar10->bytesTotal);
LAB_001f7fc2:
      pQVar10 = (this->super_QAbstractProtocolHandler).m_channel;
    }
    pQVar10->state = WaitingState;
  }
  else {
    if (CVar2 != IdleState) goto LAB_001f8399;
    bVar7 = QHttpNetworkConnectionChannel::ensureConnection
                      ((QHttpNetworkConnectionChannel *)pQVar10);
    if (!bVar7) {
LAB_001f8397:
      bVar8 = false;
      goto LAB_001f8399;
    }
    bVar7 = QHttpNetworkRequest::isPreConnect
                      (&((this->super_QAbstractProtocolHandler).m_channel)->request);
    pQVar10 = (this->super_QAbstractProtocolHandler).m_channel;
    if (bVar7) {
      pQVar10->state = IdleState;
      *(undefined4 *)(*(long *)&((this->super_QAbstractProtocolHandler).m_reply)->field_0x8 + 0xd0)
           = 4;
      QHttpNetworkConnectionChannel::allDone((QHttpNetworkConnectionChannel *)pQVar10);
      QHttpNetworkConnection::preConnectFinished
                ((QHttpNetworkConnection *)(this->super_QAbstractProtocolHandler).m_connection);
      (this->super_QAbstractProtocolHandler).m_reply = (QHttpNetworkReply *)0x0;
      goto LAB_001f8399;
    }
    pQVar10->written = 0;
    pQVar10->bytesTotal = 0;
    this_00 = *(QHttpNetworkReplyPrivate **)
               &((this->super_QAbstractProtocolHandler).m_reply)->field_0x8;
    QHttpNetworkReplyPrivate::clear(this_00);
    QWeakPointer<QObject>::assign<QObject>
              (&(this_00->connection).wp,
               &((this->super_QAbstractProtocolHandler).m_connection)->super_QObject);
    QWeakPointer<QObject>::assign<QObject>
              (&(this_00->connectionChannel).wp,
               &((this->super_QAbstractProtocolHandler).m_channel)->super_QObject);
    pQVar14 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                        (&(((this->super_QAbstractProtocolHandler).m_channel)->request).d);
    this_00->autoDecompress = pQVar14->autoDecompress;
    this_00->pipeliningUsed = false;
    QHttpNetworkRequest::url((QHttpNetworkRequest *)&local_78);
    QUrl::userInfo(&local_58,&local_78,0);
    if (CONCAT44(local_58.size._4_4_,(undefined4)local_58.size) == 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QUrl::~QUrl((QUrl *)&local_78);
    }
    else {
      bVar8 = QHttpNetworkRequest::withCredentials
                        (&((this->super_QAbstractProtocolHandler).m_channel)->request);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QUrl::~QUrl((QUrl *)&local_78);
      if (bVar8) {
        url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QHttpNetworkRequest::url((QHttpNetworkRequest *)&url);
        this_03 = &((this->super_QAbstractProtocolHandler).m_channel)->authenticator;
        QUrl::userName(&local_58,(QHttpNetworkRequest *)&url,0x7f00000);
        QAuthenticator::user((QString *)&local_78,this_03);
        bVar8 = operator!=((QString *)&local_58,(QString *)&local_78);
        if (bVar8) {
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_001f8471:
          QUrl::userName(&local_58,&url,0x7f00000);
          QAuthenticator::setUser(this_03,(QString *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          QUrl::password(&local_58,&url,0x7f00000);
          QAuthenticator::setPassword(this_03,(QString *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          this_01 = *(QHttpNetworkConnectionPrivate **)
                     &((this->super_QAbstractProtocolHandler).m_connection)->field_0x8;
          fromChannel = QHttpNetworkConnectionPrivate::indexOf
                                  (this_01,(this->super_QAbstractProtocolHandler).m_socket);
          QHttpNetworkConnectionPrivate::copyCredentials(this_01,fromChannel,this_03,false);
        }
        else {
          QUrl::password(&currentReadSize,&url,0x7f00000);
          if (local_80 == 0) {
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&currentReadSize);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          }
          else {
            QUrl::password(&local_a8,&url,0x7f00000);
            QAuthenticator::password((QString *)&local_c0,this_03);
            bVar8 = operator!=((QString *)&local_a8,(QString *)&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&currentReadSize);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            if (bVar8) goto LAB_001f8471;
          }
        }
        local_58.d._0_4_ = 0;
        local_58.d._4_4_ = 0;
        local_58.ptr._0_4_ = 0;
        local_58.ptr._4_4_ = 0;
        local_58.size._0_4_ = 0;
        local_58.size._4_4_ = 0;
        QUrl::setUserInfo((QString *)&url,(ParsingMode)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        QHttpNetworkRequest::setUrl
                  (&((this->super_QAbstractProtocolHandler).m_channel)->request,&url);
        QUrl::~QUrl(&url);
      }
    }
    bVar8 = QHttpNetworkRequest::withCredentials
                      (&((this->super_QAbstractProtocolHandler).m_channel)->request);
    if (bVar8) {
      QHttpNetworkConnectionPrivate::createAuthorization
                (*(QHttpNetworkConnectionPrivate **)
                  &((this->super_QAbstractProtocolHandler).m_connection)->field_0x8,
                 (this->super_QAbstractProtocolHandler).m_socket,
                 &((this->super_QAbstractProtocolHandler).m_channel)->request);
    }
    pQVar10 = (this->super_QAbstractProtocolHandler).m_channel;
    PVar9 = QNetworkProxy::type((QNetworkProxy *)
                                (*(long *)&((this->super_QAbstractProtocolHandler).m_connection)->
                                           field_0x8 + 0xc0));
    QHttpNetworkRequestPrivate::header((QByteArray *)&local_58,&pQVar10->request,PVar9 != NoProxy);
    pDVar6 = (this->m_header).d.d;
    pcVar13 = (this->m_header).d.ptr;
    (this->m_header).d.d = (Data *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
    (this->m_header).d.ptr = (char *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    local_58.d._0_4_ = SUB84(pDVar6,0);
    local_58.d._4_4_ = (undefined4)((ulong)pDVar6 >> 0x20);
    local_58.ptr._0_4_ = SUB84(pcVar13,0);
    local_58.ptr._4_4_ = (undefined4)((ulong)pcVar13 >> 0x20);
    qVar4 = (this->m_header).d.size;
    (this->m_header).d.size = CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
    local_58.size._0_4_ = (undefined4)qVar4;
    local_58.size._4_4_ = (undefined4)((ulong)qVar4 >> 0x20);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    pQVar15 = QHttpNetworkRequest::uploadByteDevice
                        (&((this->super_QAbstractProtocolHandler).m_channel)->request);
    if (pQVar15 == (QNonContiguousByteDevice *)0x0) {
      pQVar5 = (this->super_QAbstractProtocolHandler).m_socket;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_78.size = 0;
      std::__exchange<QByteArray,QByteArray>
                ((QByteArray *)&local_58,&this->m_header,(QByteArray *)&local_78);
      QIODevice::write((QByteArray *)pQVar5);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
      QMetaObject::invokeMethod<>
                (&((this->super_QAbstractProtocolHandler).m_reply)->super_QObject,"requestSent",
                 QueuedConnection);
      goto LAB_001f7fc2;
    }
    QObject::connect(local_c8,(char *)pQVar15,(QObject *)"2readyRead()",
                     (char *)(this->super_QAbstractProtocolHandler).m_channel,0x24e637);
    QMetaObject::Connection::~Connection((Connection *)local_c8);
    qVar16 = QHttpNetworkRequest::contentLength
                       (&((this->super_QAbstractProtocolHandler).m_channel)->request);
    pQVar10 = (this->super_QAbstractProtocolHandler).m_channel;
    pQVar10->bytesTotal = qVar16;
    pQVar10->state = WritingState;
  }
  bVar8 = true;
  (*(this->super_QAbstractProtocolHandler)._vptr_QAbstractProtocolHandler[4])(this);
LAB_001f8399:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpProtocolHandler::sendRequest()
{
    m_reply = m_channel->reply;

    if (!m_reply) {
        // heh, how should that happen!
        qWarning("QAbstractProtocolHandler::sendRequest() called without QHttpNetworkReply");
        return false;
    }

    switch (m_channel->state) {
    case QHttpNetworkConnectionChannel::IdleState: { // write the header
        if (!m_channel->ensureConnection()) {
            // wait for the connection (and encryption) to be done
            // sendRequest will be called again from either
            // _q_connected or _q_encrypted
            return false;
        }
        if (m_channel->request.isPreConnect()) {
            m_channel->state = QHttpNetworkConnectionChannel::IdleState;
            m_reply->d_func()->state = QHttpNetworkReplyPrivate::AllDoneState;
            m_channel->allDone();
            m_connection->preConnectFinished(); // will only decrease the counter
            m_reply = nullptr; // so we can reuse this channel
            return true; // we have a working connection and are done
        }

        m_channel->written = 0; // excluding the header
        m_channel->bytesTotal = 0;

        QHttpNetworkReplyPrivate *replyPrivate = m_reply->d_func();
        replyPrivate->clear();
        replyPrivate->connection = m_connection;
        replyPrivate->connectionChannel = m_channel;
        replyPrivate->autoDecompress = m_channel->request.d->autoDecompress;
        replyPrivate->pipeliningUsed = false;

        // if the url contains authentication parameters, use the new ones
        // both channels will use the new authentication parameters
        if (!m_channel->request.url().userInfo().isEmpty() && m_channel->request.withCredentials()) {
            QUrl url = m_channel->request.url();
            QAuthenticator &auth = m_channel->authenticator;
            if (url.userName() != auth.user()
                || (!url.password().isEmpty() && url.password() != auth.password())) {
                auth.setUser(url.userName());
                auth.setPassword(url.password());
                m_connection->d_func()->copyCredentials(m_connection->d_func()->indexOf(m_socket), &auth, false);
            }
            // clear the userinfo,  since we use the same request for resending
            // userinfo in url can conflict with the one in the authenticator
            url.setUserInfo(QString());
            m_channel->request.setUrl(url);
        }
        // Will only be false if Qt WebKit is performing a cross-origin XMLHttpRequest
        // and withCredentials has not been set to true.
        if (m_channel->request.withCredentials())
            m_connection->d_func()->createAuthorization(m_socket, m_channel->request);
#ifndef QT_NO_NETWORKPROXY
        m_header = QHttpNetworkRequestPrivate::header(m_channel->request,
            (m_connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy));
#else
        m_header = QHttpNetworkRequestPrivate::header(m_channel->request, false);
#endif

        // flushing is dangerous (QSslSocket calls transmit which might read or error)
//        m_socket->flush();
        QNonContiguousByteDevice* uploadByteDevice = m_channel->request.uploadByteDevice();
        if (uploadByteDevice) {
            // connect the signals so this function gets called again
            QObject::connect(uploadByteDevice, SIGNAL(readyRead()), m_channel, SLOT(_q_uploadDataReadyRead()));

            m_channel->bytesTotal = m_channel->request.contentLength();

            m_channel->state = QHttpNetworkConnectionChannel::WritingState; // start writing data
            sendRequest(); //recurse
        } else {
            // no data to send: just send the HTTP headers
            m_socket->write(std::exchange(m_header, {}));
            QMetaObject::invokeMethod(m_reply, "requestSent", Qt::QueuedConnection);
            m_channel->state = QHttpNetworkConnectionChannel::WaitingState; // now wait for response
            sendRequest(); //recurse
        }

        break;
    }
    case QHttpNetworkConnectionChannel::WritingState:
    {
        // write the data
        QNonContiguousByteDevice* uploadByteDevice = m_channel->request.uploadByteDevice();
        if (!uploadByteDevice || m_channel->bytesTotal == m_channel->written) {
            // the upload device might have no data to send, but we still have to send the headers,
            // do it now.
            if (!m_header.isEmpty())
                m_socket->write(std::exchange(m_header, {}));
            if (uploadByteDevice)
                emit m_reply->dataSendProgress(m_channel->written, m_channel->bytesTotal);
            m_channel->state = QHttpNetworkConnectionChannel::WaitingState; // now wait for response
            sendRequest(); // recurse
            break;
        }

        // only feed the QTcpSocket buffer when there is less than 32 kB in it;
        // note that the headers do not count towards these limits.
        const qint64 socketBufferFill = 32*1024;
        const qint64 socketWriteMaxSize = 16*1024;

        // if it is really an ssl socket, check more than just bytesToWrite()
#ifndef QT_NO_SSL
        QSslSocket *sslSocket = qobject_cast<QSslSocket*>(m_socket);
        const auto encryptedBytesToWrite = [sslSocket]() -> qint64
        {
            return sslSocket ? sslSocket->encryptedBytesToWrite() : 0;
        };
#else
        const auto encryptedBytesToWrite = [](){ return qint64(0); };
#endif

        // throughout this loop, we want to send the data coming from uploadByteDevice.
        // we also need to send the headers, as we try to coalesce their write with the data.
        // we won't send more than the limits above, excluding the headers
        while ((m_socket->bytesToWrite() + encryptedBytesToWrite()) <= socketBufferFill
               && m_channel->bytesTotal != m_channel->written)
        {
            // get pointer to upload data
            qint64 currentReadSize = 0;
            const qint64 desiredReadSize = qMin(socketWriteMaxSize, m_channel->bytesTotal - m_channel->written);
            const char *readPointer = uploadByteDevice->readPointer(desiredReadSize, currentReadSize);

            if (currentReadSize == -1) {
                // premature eof happened
                m_connection->d_func()->emitReplyError(m_socket, m_reply, QNetworkReply::UnknownNetworkError);
                return false;
            } else if (readPointer == nullptr || currentReadSize == 0) {
                // nothing to read currently, break the loop
                break;
            } else {
                if (m_channel->written != uploadByteDevice->pos()) {
                    // Sanity check. This was useful in tracking down an upload corruption.
                    qWarning() << "QHttpProtocolHandler: Internal error in sendRequest. Expected to write at position" << m_channel->written << "but read device is at" << uploadByteDevice->pos();
                    Q_ASSERT(m_channel->written == uploadByteDevice->pos());
                    m_connection->d_func()->emitReplyError(m_socket, m_reply, QNetworkReply::ProtocolFailure);
                    return false;
                }
                qint64 currentWriteSize;
                if (m_header.isEmpty()) {
                    currentWriteSize = m_socket->write(readPointer, currentReadSize);
                } else {
                    // assemble header and data and send them together
                    const qint64 headerSize = m_header.size();
                    m_header.append(readPointer, currentReadSize);
                    currentWriteSize = m_socket->write(std::exchange(m_header, {}));
                    if (currentWriteSize != -1)
                        currentWriteSize -= headerSize;
                    QMetaObject::invokeMethod(m_reply, "requestSent", Qt::QueuedConnection);
                }
                if (currentWriteSize == -1 || currentWriteSize != currentReadSize) {
                    // socket broke down
                    m_connection->d_func()->emitReplyError(m_socket, m_reply, QNetworkReply::UnknownNetworkError);
                    return false;
                } else {
                    m_channel->written += currentWriteSize;
                    uploadByteDevice->advanceReadPointer(currentWriteSize);

                    emit m_reply->dataSendProgress(m_channel->written, m_channel->bytesTotal);

                    if (m_channel->written == m_channel->bytesTotal) {
                        // make sure this function is called once again
                        m_channel->state = QHttpNetworkConnectionChannel::WaitingState;
                        sendRequest();
                        break;
                    }
                }
            }
        }
        break;
    }

    case QHttpNetworkConnectionChannel::WaitingState:
    {
        QNonContiguousByteDevice* uploadByteDevice = m_channel->request.uploadByteDevice();
        if (uploadByteDevice) {
            QObject::disconnect(uploadByteDevice, SIGNAL(readyRead()), m_channel, SLOT(_q_uploadDataReadyRead()));
        }

        // HTTP pipelining
        //m_connection->d_func()->fillPipeline(m_socket);
        //m_socket->flush();

        // ensure we try to receive a reply in all cases, even if _q_readyRead_ hat not been called
        // this is needed if the sends an reply before we have finished sending the request. In that
        // case receiveReply had been called before but ignored the server reply
        if (m_socket->bytesAvailable())
            QMetaObject::invokeMethod(m_channel, "_q_receiveReply", Qt::QueuedConnection);
        break;
    }
    case QHttpNetworkConnectionChannel::ReadingState:
        // ignore _q_bytesWritten in these states
        Q_FALLTHROUGH();
    default:
        break;
    }
    return true;
}